

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

double YPSpur_md_get_vel(YPSpur *spur,double *v,double *w)

{
  int iVar1;
  double time;
  undefined1 auStack_60 [4];
  int len;
  YPSpur_msg msg;
  double *w_local;
  double *v_local;
  YPSpur *spur_local;
  
  _auStack_60 = 1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x71;
  msg.pid._4_4_ = 0;
  msg.data[3] = (double)w;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)auStack_60);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local = (YPSpur *)0xbff0000000000000;
  }
  else {
    iVar1 = (*(spur->dev).recv)(&spur->dev,(YPSpur_msg *)auStack_60);
    if (iVar1 < 0) {
      spur->connection_error = 1;
      spur_local = (YPSpur *)0xbff0000000000000;
    }
    else {
      *v = (double)msg._16_8_;
      *(double *)msg.data[3] = msg.data[0];
      spur_local = (YPSpur *)msg.data[1];
    }
  }
  return (double)spur_local;
}

Assistant:

double YPSpur_md_get_vel(YPSpur* spur, double* v, double* w)
{
  YPSpur_msg msg;
  int len;
  double time;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_GET_VEL;
  msg.cs = 0;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  *v = msg.data[0];
  *w = msg.data[1];
  time = msg.data[2];
  return time;
}